

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::BlobProto::Clear(BlobProto *this)

{
  uint uVar1;
  LogMessage *other;
  BlobShape *this_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  (this->data_).current_size_ = 0;
  (this->diff_).current_size_ = 0;
  (this->double_data_).current_size_ = 0;
  (this->double_diff_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    this_00 = this->shape_;
    if (this_00 == (BlobShape *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0xd18);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_48,"CHECK failed: shape_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_49,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_48);
      this_00 = this->shape_;
    }
    BlobShape::Clear(this_00);
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x1e) != 0) {
    this->num_ = 0;
    this->channels_ = 0;
    this->height_ = 0;
    this->width_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void BlobProto::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.BlobProto)
  data_.Clear();
  diff_.Clear();
  double_data_.Clear();
  double_diff_.Clear();
  if (has_shape()) {
    GOOGLE_DCHECK(shape_ != NULL);
    shape_->::caffe::BlobShape::Clear();
  }
  if (_has_bits_[0 / 32] & 30u) {
    ::memset(&num_, 0, reinterpret_cast<char*>(&width_) -
      reinterpret_cast<char*>(&num_) + sizeof(width_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}